

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_warp_magnifier.cpp
# Opt level: O0

void __thiscall
agg::trans_warp_magnifier::inverse_transform(trans_warp_magnifier *this,double *x,double *y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double rnew;
  double r;
  double dy;
  double dx;
  double *y_local;
  double *x_local;
  trans_warp_magnifier *this_local;
  
  dVar1 = *x - *(double *)this;
  dVar2 = *y - *(double *)(this + 8);
  dVar3 = sqrt(dVar1 * dVar1 + dVar2 * dVar2);
  if (*(double *)(this + 0x18) * *(double *)(this + 0x10) <= dVar3) {
    dVar4 = -*(double *)(this + 0x18) * (*(double *)(this + 0x10) - 1.0) + dVar3;
    *x = *(double *)this + (dVar4 * dVar1) / dVar3;
    *y = *(double *)(this + 8) + (dVar4 * dVar2) / dVar3;
  }
  else {
    *x = *(double *)this + dVar1 / *(double *)(this + 0x10);
    *y = *(double *)(this + 8) + dVar2 / *(double *)(this + 0x10);
  }
  return;
}

Assistant:

void trans_warp_magnifier::inverse_transform(double* x, double* y) const
    {
        // New version by Andrew Skalkin
        //-----------------
        double dx = *x - m_xc;
        double dy = *y - m_yc;
        double r = sqrt(dx * dx + dy * dy);

        if(r < m_radius * m_magn) 
        {
            *x = m_xc + dx / m_magn;
            *y = m_yc + dy / m_magn;
        }
        else
        {
            double rnew = r - m_radius * (m_magn - 1.0);
            *x = m_xc + rnew * dx / r; 
            *y = m_yc + rnew * dy / r;
        }

        // Old version
        //-----------------
        //trans_warp_magnifier t(*this);
        //t.magnification(1.0 / m_magn);
        //t.radius(m_radius * m_magn);
        //t.transform(x, y);
    }